

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O3

int decoder_get_uint32_value(ndn_decoder_t *decoder,uint32_t *value)

{
  uint8_t *puVar1;
  int iVar2;
  uint32_t uVar3;
  int i;
  int iVar4;
  
  iVar2 = -10;
  if (decoder->offset + 4 <= decoder->input_size) {
    *value = 0;
    puVar1 = decoder->input_value;
    uVar3 = 0;
    iVar2 = 0x18;
    iVar4 = 0;
    do {
      uVar3 = uVar3 + ((uint)puVar1[decoder->offset + iVar4] << ((byte)iVar2 & 0x1f));
      *value = uVar3;
      iVar4 = iVar4 + 1;
      iVar2 = iVar2 + -8;
    } while (iVar2 != -8);
    decoder->offset = decoder->offset + 4;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static inline int
decoder_get_uint32_value(ndn_decoder_t* decoder, uint32_t* value)
{
  if (decoder->offset + 4 > decoder->input_size)
    return NDN_OVERSIZE;
  *value = 0;
  for (int i = 0; i < 4; i++) {
    *value += (uint32_t)decoder->input_value[decoder->offset + i] << (8 * (3 - i));
  }
  decoder->offset += 4;
  return 0;
}